

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void XML_ParserFree(XML_Parser parser)

{
  OPEN_INTERNAL_ENTITY *pOVar1;
  TAG *pTVar2;
  OPEN_INTERNAL_ENTITY *openEntity;
  TAG *p;
  OPEN_INTERNAL_ENTITY *entityList;
  TAG *tagList;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    return;
  }
  entityList = (OPEN_INTERNAL_ENTITY *)parser->m_tagStack;
  do {
    if (entityList == (OPEN_INTERNAL_ENTITY *)0x0) {
      if (parser->m_freeTagList == (TAG *)0x0) {
        p = (TAG *)parser->m_openInternalEntities;
        do {
          if (p == (TAG *)0x0) {
            if (parser->m_freeInternalEntities == (OPEN_INTERNAL_ENTITY *)0x0) {
              destroyBindings(parser->m_freeBindingList,parser);
              destroyBindings(parser->m_inheritedBindings,parser);
              poolDestroy(&parser->m_tempPool);
              poolDestroy(&parser->m_temp2Pool);
              (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
              if (parser->m_dtd != (DTD *)0x0) {
                dtdDestroy(parser->m_dtd,(parser->m_parentParser != (XML_Parser)0x0 ^ 0xffU) & 1,
                           &parser->m_mem);
              }
              (*(parser->m_mem).free_fcn)(parser->m_atts);
              (*(parser->m_mem).free_fcn)(parser->m_groupConnector);
              (*(parser->m_mem).free_fcn)(parser->m_buffer);
              (*(parser->m_mem).free_fcn)(parser->m_dataBuf);
              (*(parser->m_mem).free_fcn)(parser->m_nsAtts);
              (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
              if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
                (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
              }
              (*(parser->m_mem).free_fcn)(parser);
              return;
            }
            p = (TAG *)parser->m_freeInternalEntities;
            parser->m_freeInternalEntities = (OPEN_INTERNAL_ENTITY *)0x0;
          }
          pTVar2 = *(TAG **)&p->rawNameLength;
          (*(parser->m_mem).free_fcn)(p);
          p = pTVar2;
        } while( true );
      }
      entityList = (OPEN_INTERNAL_ENTITY *)parser->m_freeTagList;
      parser->m_freeTagList = (TAG *)0x0;
    }
    pOVar1 = (OPEN_INTERNAL_ENTITY *)entityList->internalEventPtr;
    (*(parser->m_mem).free_fcn)(entityList[1].entity);
    destroyBindings((BINDING *)entityList[2].internalEventPtr,parser);
    (*(parser->m_mem).free_fcn)(entityList);
    entityList = pOVar1;
  } while( true );
}

Assistant:

void XMLCALL
XML_ParserFree(XML_Parser parser)
{
  TAG *tagList;
  OPEN_INTERNAL_ENTITY *entityList;
  if (parser == NULL)
    return;
  /* free tagStack and freeTagList */
  tagList = tagStack;
  for (;;) {
    TAG *p;
    if (tagList == NULL) {
      if (freeTagList == NULL)
        break;
      tagList = freeTagList;
      freeTagList = NULL;
    }
    p = tagList;
    tagList = tagList->parent;
    FREE(p->buf);
    destroyBindings(p->bindings, parser);
    FREE(p);
  }
  /* free openInternalEntities and freeInternalEntities */
  entityList = openInternalEntities;
  for (;;) {
    OPEN_INTERNAL_ENTITY *openEntity;
    if (entityList == NULL) {
      if (freeInternalEntities == NULL)
        break;
      entityList = freeInternalEntities;
      freeInternalEntities = NULL;
    }
    openEntity = entityList;
    entityList = entityList->next;
    FREE(openEntity);
  }

  destroyBindings(freeBindingList, parser);
  destroyBindings(inheritedBindings, parser);
  poolDestroy(&tempPool);
  poolDestroy(&temp2Pool);
  FREE((void *)protocolEncodingName);
#ifdef XML_DTD
  /* external parameter entity parsers share the DTD structure
     parser->m_dtd with the root parser, so we must not destroy it
  */
  if (!isParamEntity && _dtd)
#else
  if (_dtd)
#endif /* XML_DTD */
    dtdDestroy(_dtd, (XML_Bool)!parentParser, &parser->m_mem);
  FREE((void *)atts);
#ifdef XML_ATTR_INFO
  FREE((void *)attInfo);
#endif
  FREE(groupConnector);
  FREE(buffer);
  FREE(dataBuf);
  FREE(nsAtts);
  FREE(unknownEncodingMem);
  if (unknownEncodingRelease)
    unknownEncodingRelease(unknownEncodingData);
  FREE(parser);
}